

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O3

void __thiscall
IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::IntervalTree
          (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *this,intervalVector *ivals,
          size_t depth,size_t minbucket,unsigned_long leftextent,unsigned_long rightextent,
          size_t maxbucket)

{
  unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  *this_00;
  ulong uVar1;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false> _Var2;
  long lVar3;
  unsigned_long this_01;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *this_02;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false> this_03;
  undefined8 uVar4;
  pointer pIVar5;
  ulong uVar6;
  pointer pIVar7;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *pIVar8;
  const_iterator i;
  pointer pIVar9;
  size_t depth_00;
  bool bVar10;
  intervalVector lefts;
  intervalVector rights;
  unsigned_long local_a0;
  unsigned_long local_98;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false> local_90;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> local_88;
  intervalVector local_58;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false> local_38;
  
  local_88.center = (unsigned_long)&this->left;
  this_00 = &this->right;
  (this->intervals).
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->left)._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
  (this->intervals).
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intervals).
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->right)._M_t.
  super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
  _M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
  pIVar7 = (ivals->
           super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar5 = (ivals->
           super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  depth_00 = depth - 1;
  if ((depth_00 == 0) ||
     (uVar6 = (long)pIVar5 - (long)pIVar7 >> 5, uVar6 < maxbucket && uVar6 < minbucket)) {
    if (pIVar7 != pIVar5) {
      uVar6 = (long)pIVar5 - (long)pIVar7 >> 5;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<IntervalStartSorter<std::shared_ptr<ReleaseSite>,unsigned_long>>>
                (pIVar7,pIVar5,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<IntervalStartSorter<std::shared_ptr<ReleaseSite>,unsigned_long>>>
                (pIVar7,pIVar5);
    }
    std::
    vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::operator=(&this->intervals,ivals);
  }
  else {
    local_a0 = rightextent;
    local_98 = leftextent;
    local_38._M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)minbucket;
    if (rightextent == 0 && leftextent == 0) {
      pIVar9 = pIVar7;
      if (pIVar7 != pIVar5) {
        lVar3 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<IntervalStartSorter<std::shared_ptr<ReleaseSite>,unsigned_long>>>
                  (pIVar7,pIVar5,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<IntervalStartSorter<std::shared_ptr<ReleaseSite>,unsigned_long>>>
                  (pIVar7,pIVar5);
        pIVar7 = (ivals->
                 super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pIVar9 = (ivals->
                 super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      local_98 = pIVar9->start;
      local_88.intervals.
      super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.intervals.
      super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.intervals.
      super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
                 (long)pIVar7 - (long)pIVar9 >> 5);
      pIVar7 = (ivals->
               super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pIVar9 = local_88.intervals.
               super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pIVar5 = (ivals->
                    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pIVar5 != pIVar7;
          pIVar5 = pIVar5 + 1) {
        pIVar9->start = pIVar5->stop;
        pIVar9 = (pointer)&pIVar9->stop;
      }
      pIVar5 = (pointer)&(local_88.intervals.
                          super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->stop;
      pIVar7 = local_88.intervals.
               super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pIVar5 != local_88.intervals.
                    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish &&
          local_88.intervals.
          super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.intervals.
          super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar6 = (local_88.intervals.
                 super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->start;
        do {
          uVar1 = pIVar5->start;
          bVar10 = uVar6 < uVar1;
          if (uVar6 <= uVar1) {
            uVar6 = uVar1;
          }
          if (bVar10) {
            pIVar7 = pIVar5;
          }
          pIVar5 = (pointer)&pIVar5->stop;
        } while (pIVar5 != local_88.intervals.
                           super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_a0 = pIVar7->start;
      if (local_88.intervals.
          super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.intervals.
                        super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pIVar7 = (ivals->
               super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pIVar5 = (ivals->
               super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (long)pIVar5 - (long)pIVar7 >> 5;
    }
    if (pIVar5 == pIVar7) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_88.intervals.
          super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.intervals.
                        super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ::~unique_ptr(this_00);
      std::
      unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                     *)local_88.center);
      std::
      vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ::~vector(&this->intervals);
      _Unwind_Resume(uVar4);
    }
    local_88.right._M_t.
    super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>,_true,_true>
                    )pIVar7[uVar6 >> 1].start;
    this->center = (unsigned_long)
                   local_88.right._M_t.
                   super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                   .
                   super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>
                   ._M_head_impl;
    local_88.intervals.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.intervals.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.intervals.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    do {
      pIVar8 = &local_88;
      if ((this->center <= pIVar7->stop) &&
         (pIVar8 = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&local_58,
         pIVar7->start <= this->center)) {
        pIVar8 = this;
      }
      std::
      vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ::push_back(&pIVar8->intervals,pIVar7);
      _Var2._M_head_impl = local_38._M_head_impl;
      this_01 = local_88.center;
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != (ivals->
                       super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    if (local_88.intervals.
        super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_88.intervals.
        super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_02 = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)operator_new(0x30);
      IntervalTree(this_02,&local_88.intervals,depth_00,(size_t)_Var2._M_head_impl,local_98,
                   (unsigned_long)
                   local_88.right._M_t.
                   super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                   .
                   super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>
                   ._M_head_impl,0x200);
      local_90._M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
      pIVar8 = *(IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> **)this_01;
      *(IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> **)this_01 = this_02;
      if (pIVar8 != (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0) {
        std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>::operator()
                  ((default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_> *)
                   this_01,pIVar8);
      }
      std::
      unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                     *)&local_90);
    }
    if (local_58.
        super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_03._M_head_impl =
           (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)operator_new(0x30);
      IntervalTree(this_03._M_head_impl,&local_58,depth_00,(size_t)_Var2._M_head_impl,
                   (unsigned_long)
                   local_88.right._M_t.
                   super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                   .
                   super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>
                   ._M_head_impl,local_a0,0x200);
      local_90._M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
      _Var2._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>
           ._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
      _M_head_impl = this_03._M_head_impl;
      if (_Var2._M_head_impl != (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0) {
        std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>::operator()
                  ((default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_> *)
                   this_00,_Var2._M_head_impl);
      }
      std::
      unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                     *)&local_90);
    }
    std::
    vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::~vector(&local_58);
    std::
    vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::~vector(&local_88.intervals);
  }
  return;
}

Assistant:

IntervalTree<T,K>(
            intervalVector& ivals,
            std::size_t depth = 16,
            std::size_t minbucket = 64,
            K leftextent = 0,
            K rightextent = 0,
            std::size_t maxbucket = 512
            )
        : left(nullptr)
        , right(nullptr)
    {

        --depth;
        IntervalStartSorter<T,K> intervalStartSorter;
        if (depth == 0 || (ivals.size() < minbucket && ivals.size() < maxbucket)) {
            std::sort(ivals.begin(), ivals.end(), intervalStartSorter);
            intervals = ivals;
        } else {
            if (leftextent == 0 && rightextent == 0) {
                // sort intervals by start
              std::sort(ivals.begin(), ivals.end(), intervalStartSorter);
            }

            K leftp = 0;
            K rightp = 0;
            K centerp = 0;

            if (leftextent || rightextent) {
                leftp = leftextent;
                rightp = rightextent;
            } else {
                leftp = ivals.front().start;
                std::vector<K> stops;
                stops.resize(ivals.size());
                transform(ivals.begin(), ivals.end(), stops.begin(), intervalStop<T,K>);
                rightp = *max_element(stops.begin(), stops.end());
            }

            //centerp = ( leftp + rightp ) / 2;
            centerp = ivals.at(ivals.size() / 2).start;
            center = centerp;

            intervalVector lefts;
            intervalVector rights;

            for (typename intervalVector::const_iterator i = ivals.begin(); i != ivals.end(); ++i) {
                const interval& interval = *i;
                if (interval.stop < center) {
                    lefts.push_back(interval);
                } else if (interval.start > center) {
                    rights.push_back(interval);
                } else {
                    intervals.push_back(interval);
                }
            }

            if (!lefts.empty()) {
                left = std::unique_ptr<intervalTree>(new intervalTree(lefts, depth, minbucket, leftp, centerp));
            }
            if (!rights.empty()) {
                right = std::unique_ptr<intervalTree>(new intervalTree(rights, depth, minbucket, centerp, rightp));
            }
        }
    }